

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReader::MetaData::Entry::clear(Entry *this)

{
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    if ((*(long *)(in_RDI + 0x10) != 0) && (*(void **)(in_RDI + 0x10) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 0x10));
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0x18) = 0;
    if (*(long *)(in_RDI + 0x20) != 0) {
      if (*(long **)(in_RDI + 0x20) != (long *)0x0) {
        (**(code **)(**(long **)(in_RDI + 0x20) + 8))();
      }
      *(undefined8 *)(in_RDI + 0x20) = 0;
    }
    *(undefined8 *)(in_RDI + 0x28) = 0;
    *(undefined4 *)(in_RDI + 0x30) = 0;
  }
  *(undefined8 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

void clear() {
		if (isLmd) {
		    isLmd = 0;
		    if (lmdData) { delete lmdData; lmdData = 0; }
		    lmdPos = 0;
		    lmdZipSize = 0;
		}
		else {
		    if (data) { delete [] data; }
		}
                data = 0;
	    }